

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O0

void __thiscall S2EdgeCrosser::RestartAt(S2EdgeCrosser *this,S2Point *c)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  S2Point *local_18;
  S2Point *c_local;
  S2EdgeCrosser *this_local;
  
  local_18 = c;
  c_local = (S2Point *)this;
  bVar1 = S2::IsUnitLength(c);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this->c_ = local_18;
    iVar2 = s2pred::TriageSign(this->a_,this->b_,this->c_,&this->a_cross_b_);
    this->acb_ = -iVar2;
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
             ,0x102,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_30);
  poVar3 = std::operator<<(poVar3,"Check failed: S2::IsUnitLength(*c) ");
  S2LogMessageVoidify::operator&(&local_19,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

inline void S2EdgeCrosser::RestartAt(const S2Point* c) {
  S2_DCHECK(S2::IsUnitLength(*c));
  c_ = c;
  acb_ = -s2pred::TriageSign(*a_, *b_, *c_, a_cross_b_);
}